

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::finalCheck(TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  bool bVar1;
  pointer pTVar2;
  TInfoSinkBase *pTVar3;
  TBuiltInResource *pTVar4;
  pointer pTVar5;
  char *pcVar6;
  long lVar7;
  int powerOf2;
  uint uVar8;
  uint n;
  size_t b;
  ulong uVar9;
  TFinalLinkTraverser finalLinkTraverser;
  pool_allocator<char> local_a0;
  pool_allocator<char> local_98;
  TString local_90;
  TIntermTraverser local_68;
  
  if (this->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  if (this->numEntryPoints < 1) {
    if (this->source == EShSourceGlsl) {
      error(this,infoSink,"Missing entry point: Each stage requires one entry point",EShLangCount);
    }
    else {
      warn(this,infoSink,"Entry point not found",EShLangCount);
    }
  }
  checkCallGraphCycles(this,infoSink);
  checkCallGraphBodies(this,infoSink,keepUncalled);
  inOutLocationCheck(this,infoSink);
  if (1 < this->numPushConstants) {
    error(this,infoSink,"Only one push_constant block is allowed per stage",EShLangCount);
  }
  if (this->invocations == -1) {
    this->invocations = 1;
  }
  local_98.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
             "gl_ClipDistance",&local_98);
  bVar1 = inIoAccessed(this,(TString *)&local_68);
  if (bVar1) {
    local_a0.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_90,
               "gl_ClipVertex",&local_a0);
    bVar1 = inIoAccessed(this,&local_90);
    if (bVar1) {
      error(this,infoSink,
            "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
            EShLangCount);
    }
  }
  local_98.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
             "gl_CullDistance",&local_98);
  bVar1 = inIoAccessed(this,(TString *)&local_68);
  if (bVar1) {
    local_a0.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_90,
               "gl_ClipVertex",&local_a0);
    bVar1 = inIoAccessed(this,&local_90);
    if (bVar1) {
      error(this,infoSink,
            "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
            EShLangCount);
    }
  }
  bVar1 = userOutputUsed(this);
  if (bVar1) {
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_FragColor",&local_98);
    bVar1 = inIoAccessed(this,(TString *)&local_68);
    if (!bVar1) {
      local_a0.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_90,"gl_FragData",&local_a0);
      bVar1 = inIoAccessed(this,&local_90);
      if (!bVar1) goto LAB_00377947;
    }
    error(this,infoSink,"Cannot use gl_FragColor or gl_FragData when using user-defined outputs",
          EShLangCount);
  }
LAB_00377947:
  local_98.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
             "gl_FragColor",&local_98);
  bVar1 = inIoAccessed(this,(TString *)&local_68);
  if (bVar1) {
    local_a0.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_90,
               "gl_FragData",&local_a0);
    bVar1 = inIoAccessed(this,&local_90);
    if (bVar1) {
      error(this,infoSink,"Cannot use both gl_FragColor and gl_FragData",EShLangCount);
    }
  }
  lVar7 = 0;
  for (uVar9 = 0;
      pTVar2 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(this->xfbBuffers).
                             super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x28);
      uVar9 = uVar9 + 1) {
    powerOf2 = 8;
    if ((((&pTVar2->contains64BitType)[lVar7] != false) ||
        (powerOf2 = 4, (&pTVar2->contains32BitType)[lVar7] != false)) ||
       (powerOf2 = 2, (&pTVar2->contains16BitType)[lVar7] == true)) {
      RoundToPow2<unsigned_int>((uint *)((long)&pTVar2->implicitStride + lVar7),powerOf2);
    }
    pTVar2 = (this->xfbBuffers).
             super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = *(uint *)((long)&pTVar2->stride + lVar7);
    n = (uint)uVar9;
    if (uVar8 == 0x3fff) {
      pTVar5 = (pointer)((long)&(pTVar2->ranges).
                                super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar7);
LAB_00377a2c:
      uVar8 = pTVar5->implicitStride;
      pTVar5->stride = uVar8;
    }
    else if (uVar8 < *(uint *)((long)&pTVar2->implicitStride + lVar7)) {
      error(this,infoSink,"xfb_stride is too small to hold all buffer entries:",EShLangCount);
      TInfoSinkBase::append(&infoSink->info,"ERROR: ");
      TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
      pTVar3 = TInfoSinkBase::operator<<(&infoSink->info,n);
      TInfoSinkBase::append(pTVar3,", xfb_stride ");
      pTVar3 = TInfoSinkBase::operator<<
                         (pTVar3,*(uint *)((long)&((this->xfbBuffers).
                                                                                                      
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                          + lVar7));
      TInfoSinkBase::append(pTVar3,", minimum stride needed: ");
      pTVar3 = TInfoSinkBase::operator<<
                         (pTVar3,*(uint *)((long)&((this->xfbBuffers).
                                                                                                      
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  implicitStride + lVar7));
      TInfoSinkBase::append(pTVar3,"\n");
      pTVar2 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar8 = *(uint *)((long)&pTVar2->stride + lVar7);
      pTVar5 = pTVar2 + uVar9;
      if (uVar8 == 0x3fff) goto LAB_00377a2c;
    }
    else {
      pTVar5 = (pointer)((long)&(pTVar2->ranges).
                                super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    if (pTVar5->contains64BitType == true) {
      bVar1 = IsMultipleOfPow2<unsigned_int>(uVar8,8);
      pcVar6 = "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:";
      if (bVar1) {
        pTVar2 = (this->xfbBuffers).
                 super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        goto LAB_00377b1c;
      }
LAB_00377b63:
      error(this,infoSink,pcVar6,EShLangCount);
      TInfoSinkBase::append(&infoSink->info,"ERROR: ");
      TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
      pTVar3 = TInfoSinkBase::operator<<(&infoSink->info,n);
      TInfoSinkBase::append(pTVar3,", xfb_stride ");
      pTVar3 = TInfoSinkBase::operator<<
                         (pTVar3,*(uint *)((long)&((this->xfbBuffers).
                                                                                                      
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                          + lVar7));
      TInfoSinkBase::append(pTVar3,"\n");
    }
    else {
LAB_00377b1c:
      if ((&pTVar2->contains32BitType)[lVar7] == true) {
        bVar1 = IsMultipleOfPow2<unsigned_int>(*(uint *)((long)&pTVar2->stride + lVar7),4);
        pcVar6 = "xfb_stride must be multiple of 4:";
        if (!bVar1) goto LAB_00377b63;
        pTVar2 = (this->xfbBuffers).
                 super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      if ((&pTVar2->contains16BitType)[lVar7] == true) {
        bVar1 = IsMultipleOfPow2<unsigned_int>(*(uint *)((long)&pTVar2->stride + lVar7),2);
        pcVar6 = 
        "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:";
        if (!bVar1) goto LAB_00377b63;
      }
    }
    uVar8 = *(uint *)((long)&((this->xfbBuffers).
                              super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                              ._M_impl.super__Vector_impl_data._M_start)->stride + lVar7);
    pTVar4 = MustBeAssigned<TBuiltInResource>::operator->(&this->resources);
    if ((uint)(pTVar4->maxTransformFeedbackInterleavedComponents << 2) < uVar8) {
      error(this,infoSink,"xfb_stride is too large:",EShLangCount);
      TInfoSinkBase::append(&infoSink->info,"ERROR: ");
      TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
      pTVar3 = TInfoSinkBase::operator<<(&infoSink->info,n);
      TInfoSinkBase::append(pTVar3,", components (1/4 stride) needed are ");
      pTVar3 = TInfoSinkBase::operator<<
                         (pTVar3,*(uint *)((long)&((this->xfbBuffers).
                                                                                                      
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                          + lVar7) >> 2);
      TInfoSinkBase::append(pTVar3,", gl_MaxTransformFeedbackInterleavedComponents is ");
      pTVar4 = MustBeAssigned<TBuiltInResource>::operator->(&this->resources);
      pTVar3 = TInfoSinkBase::operator<<(pTVar3,pTVar4->maxTransformFeedbackInterleavedComponents);
      TInfoSinkBase::append(pTVar3,"\n");
    }
    lVar7 = lVar7 + 0x28;
  }
  switch(this->language) {
  case EShLangVertex:
    goto switchD_00377cb7_caseD_0;
  case EShLangTessControl:
    if (this->vertices != -1) goto switchD_00377cb7_caseD_0;
    pcVar6 = "At least one shader must specify an output layout(vertices=...)";
    break;
  case EShLangTessEvaluation:
    if (this->source == EShSourceGlsl) {
      if (this->inputPrimitive == ElgNone) {
        error(this,infoSink,"At least one shader must specify an input layout primitive",
              EShLangCount);
      }
      if (this->vertexSpacing == EvsNone) {
        this->vertexSpacing = EvsEqual;
      }
      if (this->vertexOrder == EvoNone) {
        this->vertexOrder = EvoCcw;
      }
    }
    goto switchD_00377cb7_caseD_0;
  case EShLangGeometry:
    if (this->inputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an input layout primitive",EShLangCount)
      ;
    }
    if (this->outputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an output layout primitive",EShLangCount
           );
    }
    if (this->vertices != -1) goto switchD_00377cb7_caseD_0;
    pcVar6 = "At least one shader must specify a layout(max_vertices = value)";
    break;
  case EShLangFragment:
    if ((this->postDepthCoverage != true) || (this->earlyFragmentTests != false))
    goto switchD_00377cb7_caseD_0;
    pcVar6 = "post_depth_coverage requires early_fragment_tests";
    break;
  case EShLangCompute:
    goto switchD_00377cb7_caseD_5;
  case EShLangRayGen:
  case EShLangIntersect:
  case EShLangAnyHit:
  case EShLangClosestHit:
  case EShLangMiss:
  case EShLangCallable:
    if (this->numShaderRecordBlocks < 2) goto switchD_00377cb7_caseD_0;
    pcVar6 = "Only one shaderRecordNV buffer block is allowed per stage";
    break;
  case EShLangMesh:
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_Position",&local_98);
    bVar1 = inIoAccessed(this,(TString *)&local_68);
    if (bVar1) {
      local_a0.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_90,"gl_PositionPerViewNV",&local_a0);
      bVar1 = inIoAccessed(this,&local_90);
      if (bVar1) {
        error(this,infoSink,"Can only use one of gl_Position or gl_PositionPerViewNV",EShLangCount);
      }
    }
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_ClipDistance",&local_98);
    bVar1 = inIoAccessed(this,(TString *)&local_68);
    if (bVar1) {
      local_a0.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_90,"gl_ClipDistancePerViewNV",&local_a0);
      bVar1 = inIoAccessed(this,&local_90);
      if (bVar1) {
        error(this,infoSink,"Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV",
              EShLangCount);
      }
    }
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_CullDistance",&local_98);
    bVar1 = inIoAccessed(this,(TString *)&local_68);
    if (bVar1) {
      local_a0.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_90,"gl_CullDistancePerViewNV",&local_a0);
      bVar1 = inIoAccessed(this,&local_90);
      if (bVar1) {
        error(this,infoSink,"Can only use one of gl_CullDistance or gl_CullDistancePerViewNV",
              EShLangCount);
      }
    }
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_Layer",&local_98);
    bVar1 = inIoAccessed(this,(TString *)&local_68);
    if (bVar1) {
      local_a0.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_90,"gl_LayerPerViewNV",&local_a0);
      bVar1 = inIoAccessed(this,&local_90);
      if (bVar1) {
        error(this,infoSink,"Can only use one of gl_Layer or gl_LayerPerViewNV",EShLangCount);
      }
    }
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_ViewportMask",&local_98);
    bVar1 = inIoAccessed(this,(TString *)&local_68);
    if (bVar1) {
      local_a0.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_90,"gl_ViewportMaskPerViewNV",&local_a0);
      bVar1 = inIoAccessed(this,&local_90);
      if (bVar1) {
        error(this,infoSink,"Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV",
              EShLangCount);
      }
    }
    if (this->outputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an output layout primitive",EShLangCount
           );
    }
    if (this->vertices == -1) {
      error(this,infoSink,"At least one shader must specify a layout(max_vertices = value)",
            EShLangCount);
    }
    if (this->primitives == -1) {
      error(this,infoSink,"At least one shader must specify a layout(max_primitives = value)",
            EShLangCount);
    }
  case EShLangTask:
    if (1 < this->numTaskNVBlocks) {
      error(this,infoSink,"Only one taskNV interface block is allowed per shader",EShLangCount);
    }
    if (1 < this->numTaskEXTPayloads) {
      error(this,infoSink,"Only single variable of type taskPayloadSharedEXT is allowed per shader",
            EShLangCount);
    }
    goto switchD_00377cb7_caseD_5;
  default:
    pcVar6 = "Unknown Stage.";
  }
  error(this,infoSink,pcVar6,EShLangCount);
switchD_00377cb7_caseD_0:
  TIntermTraverser::TIntermTraverser(&local_68,true,false,false,false);
  local_68._vptr_TIntermTraverser = (_func_int **)&PTR__TIntermTraverser_00a5bd98;
  (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&local_68);
  return;
switchD_00377cb7_caseD_5:
  sharedBlockCheck(this,infoSink);
  goto switchD_00377cb7_caseD_0;
}

Assistant:

void TIntermediate::finalCheck(TInfoSink& infoSink, bool keepUncalled)
{
    if (getTreeRoot() == nullptr)
        return;

    if (numEntryPoints < 1) {
        if (getSource() == EShSourceGlsl)
            error(infoSink, "Missing entry point: Each stage requires one entry point");
        else
            warn(infoSink, "Entry point not found");
    }

    // recursion and missing body checking
    checkCallGraphCycles(infoSink);
    checkCallGraphBodies(infoSink, keepUncalled);

    // overlap/alias/missing I/O, etc.
    inOutLocationCheck(infoSink);

    if (getNumPushConstants() > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");

    // invocations
    if (invocations == TQualifier::layoutNotSet)
        invocations = 1;

    if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)");
    if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)");

    if (userOutputUsed() && (inIoAccessed("gl_FragColor") || inIoAccessed("gl_FragData")))
        error(infoSink, "Cannot use gl_FragColor or gl_FragData when using user-defined outputs");
    if (inIoAccessed("gl_FragColor") && inIoAccessed("gl_FragData"))
        error(infoSink, "Cannot use both gl_FragColor and gl_FragData");

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].contains64BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 8);
        else if (xfbBuffers[b].contains32BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 4);
        else if (xfbBuffers[b].contains16BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 2);

        // "It is a compile-time or link-time error to have
        // any xfb_offset that overflows xfb_stride, whether stated on declarations before or after the xfb_stride, or
        // in different compilation units. While xfb_stride can be declared multiple times for the same buffer, it is a
        // compile-time or link-time error to have different values specified for the stride for the same buffer."
        if (xfbBuffers[b].stride != TQualifier::layoutXfbStrideEnd && xfbBuffers[b].implicitStride > xfbBuffers[b].stride) {
            error(infoSink, "xfb_stride is too small to hold all buffer entries:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << ", minimum stride needed: " << xfbBuffers[b].implicitStride << "\n";
        }
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = xfbBuffers[b].implicitStride;

        // "If the buffer is capturing any
        // outputs with double-precision or 64-bit integer components, the stride must be a multiple of 8, otherwise it must be a
        // multiple of 4, or a compile-time or link-time error results."
        if (xfbBuffers[b].contains64BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 8)) {
            error(infoSink, "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        } else if (xfbBuffers[b].contains32BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 4)) {
            error(infoSink, "xfb_stride must be multiple of 4:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }
        // "If the buffer is capturing any
        // outputs with half-precision or 16-bit integer components, the stride must be a multiple of 2"
        else if (xfbBuffers[b].contains16BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 2)) {
            error(infoSink, "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }

        // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
        // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
        if (xfbBuffers[b].stride > (unsigned int)(4 * resources->maxTransformFeedbackInterleavedComponents)) {
            error(infoSink, "xfb_stride is too large:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", components (1/4 stride) needed are " << xfbBuffers[b].stride/4 << ", gl_MaxTransformFeedbackInterleavedComponents is " << resources->maxTransformFeedbackInterleavedComponents << "\n";
        }
    }

    switch (language) {
    case EShLangVertex:
        break;
    case EShLangTessControl:
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify an output layout(vertices=...)");
        break;
    case EShLangTessEvaluation:
        if (getSource() == EShSourceGlsl) {
            if (inputPrimitive == ElgNone)
                error(infoSink, "At least one shader must specify an input layout primitive");
            if (vertexSpacing == EvsNone)
                vertexSpacing = EvsEqual;
            if (vertexOrder == EvoNone)
                vertexOrder = EvoCcw;
        }
        break;
    case EShLangGeometry:
        if (inputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an input layout primitive");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        break;
    case EShLangFragment:
        // for GL_ARB_post_depth_coverage, EarlyFragmentTest is set automatically in
        // ParseHelper.cpp. So if we reach here, this must be GL_EXT_post_depth_coverage
        // requiring explicit early_fragment_tests
        if (getPostDepthCoverage() && !getEarlyFragmentTests())
            error(infoSink, "post_depth_coverage requires early_fragment_tests");
        break;
    case EShLangCompute:
        sharedBlockCheck(infoSink);
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (numShaderRecordBlocks > 1)
            error(infoSink, "Only one shaderRecordNV buffer block is allowed per stage");
        break;
    case EShLangMesh:
        // NV_mesh_shader doesn't allow use of both single-view and per-view builtins.
        if (inIoAccessed("gl_Position") && inIoAccessed("gl_PositionPerViewNV"))
            error(infoSink, "Can only use one of gl_Position or gl_PositionPerViewNV");
        if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV");
        if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_CullDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_CullDistance or gl_CullDistancePerViewNV");
        if (inIoAccessed("gl_Layer") && inIoAccessed("gl_LayerPerViewNV"))
            error(infoSink, "Can only use one of gl_Layer or gl_LayerPerViewNV");
        if (inIoAccessed("gl_ViewportMask") && inIoAccessed("gl_ViewportMaskPerViewNV"))
            error(infoSink, "Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        if (primitives == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_primitives = value)");
        [[fallthrough]];
    case EShLangTask:
        if (numTaskNVBlocks > 1)
            error(infoSink, "Only one taskNV interface block is allowed per shader");
        if (numTaskEXTPayloads > 1)
            error(infoSink, "Only single variable of type taskPayloadSharedEXT is allowed per shader");
        sharedBlockCheck(infoSink);
        break;
    default:
        error(infoSink, "Unknown Stage.");
        break;
    }

    // Process the tree for any node-specific work.
    class TFinalLinkTraverser : public TIntermTraverser {
    public:
        TFinalLinkTraverser() { }
        virtual ~TFinalLinkTraverser() { }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            // Implicitly size arrays.
            // If an unsized array is left as unsized, it effectively
            // becomes run-time sized.
            symbol->getWritableType().adoptImplicitArraySizes(false);
        }
    } finalLinkTraverser;

    treeRoot->traverse(&finalLinkTraverser);
}